

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O1

void Abs_ManFreeAray(Vec_Ptr_t *p)

{
  long lVar1;
  
  if (0 < p->nSize) {
    lVar1 = 0;
    do {
      if (p->pArray[lVar1] != (void *)0x0) {
        free(p->pArray[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nSize);
  }
  if (p->pArray != (void **)0x0) {
    free(p->pArray);
    p->pArray = (void **)0x0;
  }
  if (p != (Vec_Ptr_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Abs_ManFreeAray( Vec_Ptr_t * p )
{
    void * pTemp;
    int i;
    Vec_PtrForEachEntry( void *, p, pTemp, i )
        ABC_FREE( pTemp );
    Vec_PtrFree( p );
}